

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,FILE *fp)

{
  int *piVar1;
  Allocator *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  Mat *pMVar11;
  long lVar12;
  int id;
  int len;
  char vstr [16];
  int local_50;
  int local_4c;
  char local_48 [24];
  
  clear(this);
  local_50 = 0;
  iVar4 = __isoc99_fscanf(fp,"%d=");
  if (iVar4 == 1) {
    do {
      if (local_50 < -0x5b03) {
        local_50 = -0x5b04 - local_50;
        local_4c = 0;
        iVar5 = __isoc99_fscanf(fp,"%d",&local_4c);
        iVar4 = local_4c;
        if (iVar5 != 1) {
          load_param();
          return -1;
        }
        lVar6 = (long)local_50;
        if ((((this->params[lVar6].v.dims != 1) || (this->params[lVar6].v.w != local_4c)) ||
            (this->params[lVar6].v.elemsize != 4)) ||
           (this->params[lVar6].v.allocator != (Allocator *)0x0)) {
          pMVar11 = &this->params[lVar6].v;
          piVar1 = this->params[lVar6].v.refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = this->params[lVar6].v.allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pMVar11->data != (void *)0x0) {
                  free(*(void **)((long)pMVar11->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAVar2 + 8))();
              }
            }
          }
          sVar10 = (size_t)iVar4;
          pMVar11->data = (void *)0x0;
          this->params[lVar6].v.refcount = (int *)0x0;
          this->params[lVar6].v.elemsize = 4;
          this->params[lVar6].v.allocator = (Allocator *)0x0;
          this->params[lVar6].v.dims = 1;
          this->params[lVar6].v.w = iVar4;
          this->params[lVar6].v.h = 1;
          this->params[lVar6].v.c = 1;
          this->params[lVar6].v.cstep = sVar10;
          if (iVar4 != 0) {
            pvVar7 = malloc(sVar10 * 4 + 0x1c);
            pvVar8 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar8 - 8) = pvVar7;
            pMVar11->data = pvVar8;
            piVar1 = (int *)((long)pvVar8 + sVar10 * 4);
            this->params[lVar6].v.refcount = piVar1;
            *piVar1 = 1;
          }
        }
        if (0 < local_4c) {
          lVar6 = 0;
          lVar12 = 0;
          do {
            iVar4 = __isoc99_fscanf(fp,",%15[^,\n ]",local_48);
            if (iVar4 != 1) {
              load_param();
              return -1;
            }
            bVar3 = vstr_is_float(local_48);
            if (bVar3) {
              pcVar9 = "%f";
            }
            else {
              pcVar9 = "%d";
            }
            iVar4 = __isoc99_sscanf(local_48,pcVar9,(long)this->params[local_50].v.data + lVar6);
            if (iVar4 != 1) {
              load_param();
              return -1;
            }
            lVar12 = lVar12 + 1;
            lVar6 = lVar6 + 4;
          } while (lVar12 < local_4c);
        }
      }
      else {
        iVar4 = __isoc99_fscanf(fp,"%15s",local_48);
        if (iVar4 != 1) {
          load_param();
          return -1;
        }
        bVar3 = vstr_is_float(local_48);
        pcVar9 = "%d";
        if (bVar3) {
          pcVar9 = "%f";
        }
        iVar4 = __isoc99_sscanf(local_48,pcVar9,&this->params[local_50].field_1);
        if (iVar4 != 1) {
          load_param();
          return -1;
        }
      }
      this->params[local_50].loaded = 1;
      iVar4 = __isoc99_fscanf(fp,"%d=",&local_50);
    } while (iVar4 == 1);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(FILE* fp)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (fscanf(fp, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = fscanf(fp, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = fscanf(fp, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = fscanf(fp, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }

    return 0;
}